

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash-c.c
# Opt level: O0

uint64_t farmhash64_na(char *s,size_t len)

{
  long lVar1;
  uint64_t uVar2;
  char *pcVar3;
  uint64_t mul_00;
  long lVar4;
  long lVar5;
  char *s_00;
  uint64_t uVar6;
  ulong uVar7;
  ulong in_RSI;
  char *in_RDI;
  uint128_c_t uVar8;
  uint128_c_t uVar9;
  uint64_t mul;
  char *last64;
  char *end;
  uint128_c_t w;
  uint128_c_t v;
  uint64_t z;
  uint64_t y;
  uint64_t x;
  uint64_t seed;
  uint64_t in_stack_fffffffffffffef0;
  uint64_t in_stack_fffffffffffffef8;
  char *in_stack_ffffffffffffff00;
  size_t in_stack_ffffffffffffff18;
  char *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  uint64_t local_b0;
  uint64_t local_a8;
  size_t local_a0;
  char *in_stack_ffffffffffffff70;
  uint64_t local_88;
  uint64_t local_80;
  uint64_t local_78;
  uint64_t local_70;
  uint128_c_t local_58;
  uint128_c_t local_48;
  ulong local_38;
  uint64_t local_30;
  uint64_t local_28 [2];
  ulong local_18;
  char *local_10;
  uint64_t local_8;
  
  local_28[1] = 0x51;
  if (in_RSI < 0x21) {
    if (in_RSI < 0x11) {
      local_8 = farmhash_na_len_0_to_16(in_stack_ffffffffffffff28,(size_t)in_stack_ffffffffffffff20)
      ;
    }
    else {
      local_8 = farmhash_na_len_17_to_32(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    }
  }
  else if (in_RSI < 0x41) {
    local_8 = farmhash_na_len_33_to_64(in_stack_ffffffffffffff70,local_a0);
  }
  else {
    local_28[0] = 0x51;
    local_30 = 0x226bb95b4e64b6d4;
    local_18 = in_RSI;
    local_10 = in_RDI;
    local_38 = smix(0x919387da22096bdd);
    local_38 = local_38 * -0x651e95c4d06fbfb1;
    local_48 = make_uint128_c_t(0,0);
    local_58 = make_uint128_c_t(0,0);
    lVar1 = local_28[0] * -0x651e95c4d06fbfb1;
    uVar2 = fetch64(local_10);
    local_28[0] = lVar1 + uVar2;
    pcVar3 = local_10 + (local_18 - 1 & 0xffffffffffffffc0);
    uVar7 = local_18 - 1 & 0x3f;
    do {
      lVar1 = local_28[0] + local_30 + local_48.a;
      uVar2 = fetch64(local_10 + 8);
      uVar2 = ror64(lVar1 + uVar2,0x25);
      local_28[0] = uVar2 * -0x4b6d499041670d8d;
      lVar1 = local_30 + local_48.b;
      uVar2 = fetch64(local_10 + 0x30);
      local_30 = ror64(lVar1 + uVar2,0x2a);
      local_30 = local_30 * -0x4b6d499041670d8d;
      local_28[0] = local_58.b ^ local_28[0];
      uVar2 = fetch64(local_10 + 0x28);
      local_30 = local_48.a + uVar2 + local_30;
      local_38 = ror64(local_38 + local_58.a,0x21);
      local_38 = local_38 * -0x4b6d499041670d8d;
      local_48 = weak_farmhash_na_len_32_with_seeds
                           (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                            in_stack_fffffffffffffef0);
      local_78 = local_48.a;
      local_70 = local_48.b;
      fetch64(local_10 + 0x10);
      local_58 = weak_farmhash_na_len_32_with_seeds
                           (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                            in_stack_fffffffffffffef0);
      local_88 = local_58.a;
      local_80 = local_58.b;
      swap64(&local_38,local_28);
      local_10 = local_10 + 0x40;
    } while (local_10 != pcVar3);
    mul_00 = (local_38 & 0xff) * 2 + 0xb492b66fbe98f273;
    lVar1 = (local_18 - 1 & 0x3f) + local_88;
    lVar4 = lVar1 + local_78;
    lVar5 = local_28[0] + local_30;
    local_10 = pcVar3 + (uVar7 - 0x3f);
    uVar2 = fetch64(pcVar3 + (uVar7 - 0x37));
    uVar2 = ror64(lVar5 + lVar4 + uVar2,0x25);
    local_28[0] = uVar2 * mul_00;
    lVar5 = local_30 + local_70;
    uVar2 = fetch64(local_10 + 0x30);
    local_30 = ror64(lVar5 + uVar2,0x2a);
    local_30 = local_30 * mul_00;
    local_28[0] = local_80 * 9 ^ local_28[0];
    uVar2 = fetch64(local_10 + 0x28);
    local_30 = lVar4 * 9 + uVar2 + local_30;
    local_38 = ror64(local_38 + lVar4 + lVar1,0x21);
    local_38 = local_38 * mul_00;
    uVar8 = weak_farmhash_na_len_32_with_seeds
                      (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0
                      );
    local_a0 = uVar8.a;
    pcVar3 = local_10 + 0x20;
    s_00 = (char *)(local_38 + local_80);
    uVar2 = local_30;
    fetch64(local_10 + 0x10);
    uVar9 = weak_farmhash_na_len_32_with_seeds(s_00,(uint64_t)pcVar3,uVar2);
    local_b0 = uVar9.a;
    local_a8 = uVar9.b;
    swap64(&local_38,local_28);
    uVar2 = farmhash_len_16_mul(local_a0,local_b0,mul_00);
    uVar6 = smix(local_30);
    uVar2 = uVar2 + uVar6 * -0x3c5a37a36834ced9 + local_38;
    uVar6 = farmhash_len_16_mul(uVar8.b,local_a8,mul_00);
    local_8 = farmhash_len_16_mul(uVar2,uVar6 + local_28[0],mul_00);
  }
  return local_8;
}

Assistant:

uint64_t farmhash64_na(const char *s, size_t len) {
  const uint64_t seed = 81;
  if (len <= 32) {
    if (len <= 16) {
      return farmhash_na_len_0_to_16(s, len);
    } else {
      return farmhash_na_len_17_to_32(s, len);
    }
  } else if (len <= 64) {
    return farmhash_na_len_33_to_64(s, len);
  }

  // For strings over 64 bytes we loop.  Internal state consists of
  // 56 bytes: v, w, x, y, and z.
  uint64_t x = seed;
  uint64_t y = seed * k1 + 113;
  uint64_t z = smix(y * k2 + 113) * k2;
  uint128_c_t v = make_uint128_c_t(0, 0);
  uint128_c_t w = make_uint128_c_t(0, 0);
  x = x * k2 + fetch64(s);

  // Set end so that after the loop we have 1 to 64 bytes left to process.
  const char* end = s + ((len - 1) / 64) * 64;
  const char* last64 = end + ((len - 1) & 63) - 63;
  assert(s + len - 64 == last64);
  do {
    x = ror64(x + y + v.a + fetch64(s + 8), 37) * k1;
    y = ror64(y + v.b + fetch64(s + 48), 42) * k1;
    x ^= w.b;
    y += v.a + fetch64(s + 40);
    z = ror64(z + w.a, 33) * k1;
    v = weak_farmhash_na_len_32_with_seeds(s, v.b * k1, x + w.a);
    w = weak_farmhash_na_len_32_with_seeds(s + 32, z + w.b, y + fetch64(s + 16));
    swap64(&z, &x);
    s += 64;
  } while (s != end);
  uint64_t mul = k1 + ((z & 0xff) << 1);
  // Make s point to the last 64 bytes of input.
  s = last64;
  w.a += ((len - 1) & 63);
  v.a += w.a;
  w.a += v.a;
  x = ror64(x + y + v.a + fetch64(s + 8), 37) * mul;
  y = ror64(y + v.b + fetch64(s + 48), 42) * mul;
  x ^= w.b * 9;
  y += v.a * 9 + fetch64(s + 40);
  z = ror64(z + w.a, 33) * mul;
  v = weak_farmhash_na_len_32_with_seeds(s, v.b * mul, x + w.a);
  w = weak_farmhash_na_len_32_with_seeds(s + 32, z + w.b, y + fetch64(s + 16));
  swap64(&z, &x);
  return farmhash_len_16_mul(farmhash_len_16_mul(v.a, w.a, mul) + smix(y) * k0 + z,
                   farmhash_len_16_mul(v.b, w.b, mul) + x,
                   mul);
}